

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::TempDirectorySetting::ResetGlobal(DatabaseInstance *db,DBConfig *config)

{
  BufferManager *pBVar1;
  PermissionException *this;
  __native_type local_6c0 [8];
  bool local_578;
  
  if ((config->options).enable_external_access != false) {
    DBConfig::SetDefaultTempDirectory(config);
    DBConfig::DBConfig((DBConfig *)&local_6c0[0].__data);
    (config->options).use_temporary_directory = local_578;
    DBConfig::~DBConfig((DBConfig *)&local_6c0[0].__data);
    if (db != (DatabaseInstance *)0x0) {
      pBVar1 = BufferManager::GetBufferManager(db);
      (*pBVar1->_vptr_BufferManager[0x1c])(pBVar1,&(config->options).temporary_directory);
    }
    return;
  }
  this = (PermissionException *)__cxa_allocate_exception(0x10);
  local_6c0[0]._0_8_ = &local_6c0[0].__data.__kind;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c0,"Modifying the temp_directory has been disabled by configuration",
             "");
  PermissionException::PermissionException(this,(string *)&local_6c0[0].__data);
  __cxa_throw(this,&PermissionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TempDirectorySetting::ResetGlobal(DatabaseInstance *db, DBConfig &config) {
	if (!config.options.enable_external_access) {
		throw PermissionException("Modifying the temp_directory has been disabled by configuration");
	}
	config.SetDefaultTempDirectory();
	config.options.use_temporary_directory = DBConfig().options.use_temporary_directory;
	if (db) {
		auto &buffer_manager = BufferManager::GetBufferManager(*db);
		buffer_manager.SetTemporaryDirectory(config.options.temporary_directory);
	}
}